

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# method_property.cpp
# Opt level: O2

void __thiscall
MethodProperty_Traits_Test::~MethodProperty_Traits_Test(MethodProperty_Traits_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MethodProperty, Traits)
{
  BasicMethodProperties obj;
  
  EXPECT_TRUE( prop::detail::IsProperty< decltype( obj.ro_int_value ) >::value );
  EXPECT_TRUE( prop::detail::IsProperty< decltype( obj.ro_int_value2 ) >::value );
  EXPECT_TRUE( prop::detail::IsProperty< decltype( obj.int_value ) >::value );
  EXPECT_TRUE( prop::detail::IsProperty< decltype( obj.int_value2 ) >::value );
  EXPECT_TRUE( prop::detail::IsProperty< decltype( obj.int_value3 ) >::value );
  EXPECT_TRUE( prop::detail::IsProperty< decltype( obj.ro_string_value ) >::value );
  EXPECT_TRUE( prop::detail::IsProperty< decltype( obj.ro_string_value2 ) >::value );
  EXPECT_TRUE( prop::detail::IsProperty< decltype( obj.string_value ) >::value );
  EXPECT_TRUE( prop::detail::IsProperty< decltype( obj.string_value2 ) >::value );
  EXPECT_TRUE( prop::detail::IsProperty< decltype( obj.string_value3 ) >::value );
  
  EXPECT_FALSE( prop::detail::IsAliasProperty< decltype( obj.ro_int_value ) >::value );
  EXPECT_FALSE( prop::detail::IsAliasProperty< decltype( obj.ro_int_value2 ) >::value );
  EXPECT_FALSE( prop::detail::IsAliasProperty< decltype( obj.int_value ) >::value );
  EXPECT_FALSE( prop::detail::IsAliasProperty< decltype( obj.int_value2 ) >::value );
  EXPECT_FALSE( prop::detail::IsAliasProperty< decltype( obj.int_value3 ) >::value );
  EXPECT_FALSE( prop::detail::IsAliasProperty< decltype( obj.ro_string_value ) >::value );
  EXPECT_FALSE( prop::detail::IsAliasProperty< decltype( obj.ro_string_value2 ) >::value );
  EXPECT_FALSE( prop::detail::IsAliasProperty< decltype( obj.string_value ) >::value );
  EXPECT_FALSE( prop::detail::IsAliasProperty< decltype( obj.string_value2 ) >::value );
  EXPECT_FALSE( prop::detail::IsAliasProperty< decltype( obj.string_value3 ) >::value );
  
  EXPECT_EQ( sizeof( char ), sizeof( obj.ro_int_value ) );
  EXPECT_EQ( sizeof( char ), sizeof( obj.ro_int_value2 ) );
  EXPECT_EQ( sizeof( char ), sizeof( obj.int_value ) );
  EXPECT_EQ( sizeof( char ), sizeof( obj.int_value2 ) );
  EXPECT_EQ( sizeof( char ), sizeof( obj.int_value3 ) );
  EXPECT_EQ( sizeof( char ), sizeof( obj.ro_string_value ) );
  EXPECT_EQ( sizeof( char ), sizeof( obj.ro_string_value2 ) );
  EXPECT_EQ( sizeof( char ), sizeof( obj.string_value ) );
  EXPECT_EQ( sizeof( char ), sizeof( obj.string_value2 ) );
  EXPECT_EQ( sizeof( char ), sizeof( obj.string_value3 ) );
}